

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall GdlPass::DebugRulePrecedence(GdlPass *this,GrcManager *pcman,ostream *strmOut)

{
  ulong uVar1;
  pointer ppGVar2;
  pointer ppGVar3;
  GdlRule *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer __last;
  ostream *poVar7;
  long lVar8;
  int *__buffer;
  ulong uVar9;
  pointer piVar10;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar16;
  undefined1 auVar15 [16];
  pair<int_*,_long> pVar17;
  vector<int,_std::allocator<int>_> viruleSorted;
  allocator_type local_69;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_silnrsi[P]grcompiler_compiler_Compiler_cpp:868:61)>
  local_68;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  int *local_40;
  GrcManager *local_38;
  undefined1 auVar14 [16];
  
  ppGVar2 = (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppGVar3 = (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = pcman;
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nPASS: ",7);
  poVar7 = (ostream *)std::ostream::operator<<(strmOut,this->m_nGlobalID + this->m_nPreBidiPass + 1)
  ;
  if (ppGVar2 != ppGVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (GDL #",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_nNumber);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_58,
               (long)(this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,&local_69);
    __last = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    piVar10 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    auVar6 = _DAT_00204030;
    auVar5 = _DAT_00204020;
    auVar4 = _DAT_00204010;
    local_68._M_comp.this = (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)this;
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar1 = ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) - 4;
      auVar15._8_4_ = (int)uVar1;
      auVar15._0_8_ = uVar1;
      auVar15._12_4_ = (int)(uVar1 >> 0x20);
      auVar11._0_8_ = uVar1 >> 2;
      auVar11._8_8_ = auVar15._8_8_ >> 2;
      uVar9 = 0;
      auVar11 = auVar11 ^ _DAT_00204030;
      do {
        iVar13 = (int)uVar9;
        auVar14._8_4_ = iVar13;
        auVar14._0_8_ = uVar9;
        auVar14._12_4_ = (int)(uVar9 >> 0x20);
        auVar15 = (auVar14 | auVar5) ^ auVar6;
        iVar12 = auVar11._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                    iVar12 < auVar15._4_4_) & 1)) {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] = iVar13;
        }
        if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
            auVar15._12_4_ <= auVar11._12_4_) {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9 + 1] = iVar13 + 1;
        }
        auVar15 = (auVar14 | auVar4) ^ auVar6;
        iVar16 = auVar15._4_4_;
        if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9 + 2] = iVar13 + 2;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9 + 3] = iVar13 + 3;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar1 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        lVar8 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        pVar17 = std::get_temporary_buffer<int>((lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
        lVar8 = pVar17.second;
        __buffer = pVar17.first;
        if (__buffer == (int *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<GdlPass::DebugRulePrecedence(GrcManager*,std::ostream&)::__0>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar10,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last,
                     local_68);
          lVar8 = 0;
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<GdlPass::DebugRulePrecedence(GrcManager*,std::ostream&)::__0>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar10,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last,
                     __buffer,lVar8,local_68);
        }
        operator_delete(__buffer,lVar8 << 2);
      }
    }
    local_40 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_5c = *(int *)((long)local_68._M_comp.this + 0x90) +
                 *(int *)((long)local_68._M_comp.this + 0x94) + 1;
      piVar10 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar12 = *piVar10;
        this_00 = (((vector<GdlRule_*,_std::allocator<GdlRule_*>_> *)
                   ((long)local_68._M_comp.this + 0x38))->
                  super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar12];
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)strmOut);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," - RULE ",8);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_5c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        GrpLineAndFile::WriteToStream((GrpLineAndFile *)this_00,strmOut,true);
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,":  ",3);
        GdlRule::RulePrettyPrint(this_00,local_38,strmOut,false);
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n\n",2);
        piVar10 = piVar10 + 1;
      } while (piVar10 != local_40);
    }
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - no rules\n",0xc);
  return;
}

Assistant:

void GdlPass::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut)
{
	if (m_vprule.size() == 0)
	{
		strmOut << "\nPASS: " << PassDebuggerNumber() << " - no rules\n";
		return;
	}

	Assert(PassDebuggerNumber() != 0);

	strmOut << "\nPASS: " << PassDebuggerNumber() << " (GDL #" << this->m_nNumber << ")\n";

	// Stable sort rules by their precedence: by the number of items matched (largest first).
	std::vector<int> viruleSorted(m_vprule.size());
	std::iota(viruleSorted.begin(), viruleSorted.end(), 0);
	std::stable_sort(viruleSorted.begin(), viruleSorted.end(), [&](auto const a, auto const b){
		return m_vprule[a]->SortKey() > m_vprule[b]->SortKey();
	});

	auto const nPassNum = PassDebuggerNumber();
	auto seq = 0u;
	for (auto const irule: viruleSorted) 
	{
		auto & rule = *m_vprule[irule];
		strmOut << "\n" << seq++ << " - RULE " << nPassNum << "." << irule << ", ";
		rule.LineAndFile().WriteToStream(strmOut, true);
		strmOut << ":  ";

		rule.RulePrettyPrint(pcman, strmOut, false);
		strmOut << "\n\n";
	}
}